

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O3

void __thiscall
SimpleBVH::BVH::leaf_callback(BVH *this,VectorMax3d *p,int f,VectorMax3d *np,double *sq_d)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  long lVar4;
  double *pdVar5;
  Index i;
  long lVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  Index i_1;
  ulong uVar10;
  array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_3UL> local_80;
  
  if ((this->leafCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_80._M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0]._0_4_ = f;
    (*(this->leafCallback)._M_invoker)((_Any_data *)&this->leafCallback,p,(int *)&local_80,np,sq_d);
    return;
  }
  lVar7 = (this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  if (lVar7 == 3) {
    if (-1 < f) {
      lVar6 = (long)f;
      lVar7 = (this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
      if (lVar6 < lVar7) {
        pdVar5 = (this->vertices).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        uVar2 = (this->vertices).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols;
        if ((long)uVar2 < 0 && pdVar5 != (double *)0x0) goto LAB_00119857;
        piVar3 = (this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        iVar1 = piVar3[lVar6];
        if ((-1 < iVar1) &&
           (lVar4 = (this->vertices).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_rows, iVar1 < lVar4)) {
          if (3 < uVar2) goto LAB_00119876;
          local_80._M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
          m_storage.m_rows = uVar2;
          local_80._M_elems[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
          m_storage.m_rows = uVar2;
          if (uVar2 == 0) {
            if ((-1 < (long)piVar3[lVar7 + lVar6]) && (piVar3[lVar7 + lVar6] < lVar4)) {
              local_80._M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
              m_storage.m_rows = 0;
              if ((-1 < (long)piVar3[lVar7 * 2 + lVar6]) && (piVar3[lVar7 * 2 + lVar6] < lVar4))
              goto LAB_001197c8;
            }
          }
          else {
            pdVar9 = pdVar5 + iVar1;
            uVar10 = 0;
            do {
              local_80._M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
              m_storage.m_data.array[uVar10] = *pdVar9;
              uVar10 = uVar10 + 1;
              pdVar9 = pdVar9 + lVar4;
            } while (uVar2 != uVar10);
            lVar8 = (long)piVar3[lVar7 + lVar6];
            if ((-1 < lVar8) && (lVar8 < lVar4)) {
              pdVar9 = pdVar5 + lVar8;
              uVar10 = 0;
              local_80._M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
              m_storage.m_rows = uVar2;
              do {
                local_80._M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                m_storage.m_data.array[uVar10] = *pdVar9;
                uVar10 = uVar10 + 1;
                pdVar9 = pdVar9 + lVar4;
              } while (uVar2 != uVar10);
              lVar7 = (long)piVar3[lVar7 * 2 + lVar6];
              if ((-1 < lVar7) && (lVar7 < lVar4)) {
                pdVar5 = pdVar5 + lVar7;
                uVar10 = 0;
                do {
                  local_80._M_elems[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                  .m_storage.m_data.array[uVar10] = *pdVar5;
                  uVar10 = uVar10 + 1;
                  pdVar5 = pdVar5 + lVar4;
                } while (uVar2 != uVar10);
LAB_001197c8:
                point_triangle_squared_distance(p,&local_80,np,sq_d);
                return;
              }
            }
          }
        }
        goto LAB_00119819;
      }
    }
  }
  else {
    if (lVar7 != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0x22c,
                    "void SimpleBVH::BVH::leaf_callback(const VectorMax3d &, int, VectorMax3d &, double &) const"
                   );
    }
    if (-1 < f) {
      lVar6 = (long)f;
      lVar7 = (this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
      if (lVar6 < lVar7) {
        pdVar5 = (this->vertices).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        uVar2 = (this->vertices).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols;
        if ((long)uVar2 < 0 && pdVar5 != (double *)0x0) {
LAB_00119857:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,
                        "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/MapBase.h"
                        ,0xb2,
                        "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                       );
        }
        piVar3 = (this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        iVar1 = piVar3[lVar6];
        if ((iVar1 < 0) ||
           (lVar4 = (this->vertices).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_rows, lVar4 <= iVar1)) goto LAB_00119819;
        if (3 < uVar2) {
LAB_00119876:
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,
                        "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/PlainObjectBase.h"
                        ,0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                       );
        }
        local_80._M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage
        .m_rows = uVar2;
        if (uVar2 == 0) {
          if (((long)piVar3[lVar7 + lVar6] < 0) || (lVar4 <= piVar3[lVar7 + lVar6]))
          goto LAB_00119819;
          local_80._M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
          m_storage.m_rows = 0;
        }
        else {
          pdVar9 = pdVar5 + iVar1;
          uVar10 = 0;
          do {
            local_80._M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
            m_storage.m_data.array[uVar10] = *pdVar9;
            uVar10 = uVar10 + 1;
            pdVar9 = pdVar9 + lVar4;
          } while (uVar2 != uVar10);
          lVar7 = (long)piVar3[lVar7 + lVar6];
          if ((lVar7 < 0) || (lVar4 <= lVar7)) {
LAB_00119819:
            __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                          ,
                          "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/Block.h"
                          ,0x7a,
                          "Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                         );
          }
          pdVar5 = pdVar5 + lVar7;
          uVar10 = 0;
          local_80._M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
          m_storage.m_rows = uVar2;
          do {
            local_80._M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
            m_storage.m_data.array[uVar10] = *pdVar5;
            uVar10 = uVar10 + 1;
            pdVar5 = pdVar5 + lVar4;
          } while (uVar2 != uVar10);
        }
        point_segment_squared_distance
                  (p,(array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *)&local_80,np,sq_d);
        return;
      }
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x77,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<int, -1, -1>, Level = 0]"
               );
}

Assistant:

void BVH::leaf_callback(
    const VectorMax3d& p, int f, VectorMax3d& np, double& sq_d) const
{
    if (leafCallback) {
        leafCallback(p, f, np, sq_d);
        return;
    }

    if (faces.cols() == 2) {
        point_segment_squared_distance(
            p, { { vertices.row(faces(f, 0)), vertices.row(faces(f, 1)) } }, np,
            sq_d);
        return;
    } else if (faces.cols() == 3) {
        point_triangle_squared_distance(
            p,
            { { vertices.row(faces(f, 0)), vertices.row(faces(f, 1)),
                vertices.row(faces(f, 2)) } },
            np, sq_d);
        return;
    }

    assert(false);
}